

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_shift(yyParser *yypParser,int yyNewState,int yyMajor,YYMINORTYPE *yypMinor)

{
  int *piVar1;
  undefined8 *in_RCX;
  undefined1 in_DL;
  undefined2 in_SI;
  int *in_RDI;
  yyStackEntry *yytos;
  YYMINORTYPE *in_stack_ffffffffffffffd8;
  yyParser *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RDI + 1;
  if (*in_RDI < 100) {
    piVar1 = in_RDI + (long)*in_RDI * 8 + 4;
    *(undefined2 *)piVar1 = in_SI;
    *(undefined1 *)((long)piVar1 + 2) = in_DL;
    *(undefined8 *)(piVar1 + 2) = *in_RCX;
    *(undefined8 *)(piVar1 + 4) = in_RCX[1];
    *(undefined8 *)(piVar1 + 6) = in_RCX[2];
  }
  else {
    yyStackOverflow(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void yy_shift(
  yyParser *yypParser,          /* The parser to be shifted */
  int yyNewState,               /* The new state to shift in */
  int yyMajor,                  /* The major token to shift in */
  YYMINORTYPE *yypMinor         /* Pointer to the minor token to shift in */
){
  yyStackEntry *yytos;
  yypParser->yyidx++;
#ifdef YYTRACKMAXSTACKDEPTH
  if( yypParser->yyidx>yypParser->yyidxMax ){
    yypParser->yyidxMax = yypParser->yyidx;
  }
#endif
#if YYSTACKDEPTH>0 
  if( yypParser->yyidx>=YYSTACKDEPTH ){
    yyStackOverflow(yypParser, yypMinor);
    return;
  }
#else
  if( yypParser->yyidx>=yypParser->yystksz ){
    yyGrowStack(yypParser);
    if( yypParser->yyidx>=yypParser->yystksz ){
      yyStackOverflow(yypParser, yypMinor);
      return;
    }
  }
#endif
  yytos = &yypParser->yystack[yypParser->yyidx];
  yytos->stateno = (YYACTIONTYPE)yyNewState;
  yytos->major = (YYCODETYPE)yyMajor;
  yytos->minor = *yypMinor;
#ifndef NDEBUG
  if( yyTraceFILE && yypParser->yyidx>0 ){
    int i;
    fprintf(yyTraceFILE,"%sShift %d\n",yyTracePrompt,yyNewState);
    fprintf(yyTraceFILE,"%sStack:",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE," %s",yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"\n");
  }
#endif
}